

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::ActiveTipChange(ValidationSignals *this,CBlockIndex *new_tip,bool is_ibd)

{
  _List_node_base *p_Var1;
  long lVar2;
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> mutexIn;
  string_view source_file;
  bool bVar3;
  Logger *pLVar4;
  _List_iterator<ValidationSignalsImpl::ListEntry> __position;
  int *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  base_blob<256u> local_158 [32];
  string local_138 [4];
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = ::LogAcceptCategory((LogFlags)this,(Level)new_tip);
  if (bVar3) {
    CBlockIndex::GetBlockHash((uint256 *)local_158,new_tip);
    base_blob<256u>::ToString_abi_cxx11_(local_138,local_158);
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar4);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char[16],std::__cxx11::string,int>
                ((string *)&lock,(tinyformat *)"%s: new block hash=%s block height=%d\n",
                 "ActiveTipChange",(char (*) [16])local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &new_tip->nHeight,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock
                );
      std::__cxx11::string::~string((string *)&lock);
      pLVar4 = LogInstance();
      lock.super_unique_lock._M_device = (mutex_type *)0x60;
      lock.super_unique_lock._8_8_ = anon_var_dwarf_2db03d9;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
      ;
      source_file._M_len = 0x60;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "ActiveTipChange";
      logging_function._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xbc,VALIDATION,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)local_138);
  }
  mutexIn._M_head_impl =
       (this->m_internals)._M_t.
       super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
       _M_t.
       super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
       super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock,&(mutexIn._M_head_impl)->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
             ,0x53,false);
  __position._M_node =
       (_List_node_base *)
       (((mutex *)
        &((mutexIn._M_head_impl)->m_list).
         super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
        )->super___mutex_base)._M_mutex.__align;
  while (__position._M_node != (_List_node_base *)&(mutexIn._M_head_impl)->m_list) {
    *(int *)&__position._M_node[2]._M_next = *(int *)&__position._M_node[2]._M_next + 1;
    UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
              ((reverse_lock *)&log_msg,&lock,"lock",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
               ,0x57);
    (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)
              (__position._M_node[1]._M_next,new_tip,is_ibd);
    UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock((reverse_lock *)&log_msg);
    p_Var1 = __position._M_node + 2;
    *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
    if (*(int *)&p_Var1->_M_next == 0) {
      __position._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
           ::erase(&(mutexIn._M_head_impl)->m_list,__position._M_node);
    }
    else {
      __position = std::next<std::_List_iterator<ValidationSignalsImpl::ListEntry>>(__position,1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    LOG_EVENT("%s: new block hash=%s block height=%d", __func__, new_tip.GetBlockHash().ToString(), new_tip.nHeight);
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ActiveTipChange(new_tip, is_ibd); });
}